

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_init2(__mpz_struct *r,mp_bitcnt_t bits)

{
  long size;
  mp_ptr pmVar1;
  mp_size_t rn;
  mp_bitcnt_t bits_local;
  __mpz_struct *r_local;
  
  size = (bits - (long)(int)(uint)(bits != 0) >> 6) + 1;
  r->_mp_alloc = (int)size;
  r->_mp_size = 0;
  pmVar1 = gmp_xalloc_limbs(size);
  r->_mp_d = pmVar1;
  return;
}

Assistant:

void
mpz_init2 (mpz_t r, mp_bitcnt_t bits)
{
  mp_size_t rn;

  bits -= (bits != 0);		/* Round down, except if 0 */
  rn = 1 + bits / GMP_LIMB_BITS;

  r->_mp_alloc = rn;
  r->_mp_size = 0;
  r->_mp_d = gmp_xalloc_limbs (rn);
}